

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O1

void __thiscall cbtGImpactShapeInterface::setMargin(cbtGImpactShapeInterface *this,cbtScalar margin)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  
  *(cbtScalar *)&(this->super_cbtConcaveShape).super_cbtCollisionShape.field_0x1c = margin;
  uVar1 = (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x16])();
  while (uVar1 != 0) {
    uVar1 = uVar1 - 1;
    iVar2 = (*(this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x1f])
                      (this,(ulong)uVar1);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))
              (margin,(long *)CONCAT44(extraout_var,iVar2));
  }
  this->m_needs_update = true;
  return;
}

Assistant:

virtual void setMargin(cbtScalar margin)
	{
		m_collisionMargin = margin;
		int i = getNumChildShapes();
		while (i--)
		{
			cbtCollisionShape* child = getChildShape(i);
			child->setMargin(margin);
		}

		m_needs_update = true;
	}